

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  uint uVar66;
  ulong uVar67;
  long lVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar84;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [32];
  float fVar96;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar106;
  float fVar107;
  undefined1 auVar105 [64];
  float fVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [64];
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar122 [32];
  float fVar125;
  undefined1 auVar123 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar134 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  float fVar153;
  undefined1 auVar152 [64];
  float fVar154;
  float fVar155;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  undefined1 auVar168 [32];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [64];
  float fVar176;
  float fVar177;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar179 [64];
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1910;
  long local_1908;
  undefined1 local_1880 [16];
  undefined1 local_1870 [16];
  undefined1 local_1860 [32];
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [32];
  undefined1 local_17e0 [32];
  RTCFilterFunctionNArguments local_17b0;
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [8];
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  undefined4 uStack_15e4;
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  float local_1360 [4];
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1680._4_4_ = uVar1;
  local_1680._0_4_ = uVar1;
  local_1680._8_4_ = uVar1;
  local_1680._12_4_ = uVar1;
  local_1680._16_4_ = uVar1;
  local_1680._20_4_ = uVar1;
  local_1680._24_4_ = uVar1;
  local_1680._28_4_ = uVar1;
  auVar150 = ZEXT3264(local_1680);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_16a0._4_4_ = uVar1;
  local_16a0._0_4_ = uVar1;
  local_16a0._8_4_ = uVar1;
  local_16a0._12_4_ = uVar1;
  local_16a0._16_4_ = uVar1;
  local_16a0._20_4_ = uVar1;
  local_16a0._24_4_ = uVar1;
  local_16a0._28_4_ = uVar1;
  auVar152 = ZEXT3264(local_16a0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_16c0._4_4_ = uVar1;
  local_16c0._0_4_ = uVar1;
  local_16c0._8_4_ = uVar1;
  local_16c0._12_4_ = uVar1;
  local_16c0._16_4_ = uVar1;
  local_16c0._20_4_ = uVar1;
  local_16c0._24_4_ = uVar1;
  local_16c0._28_4_ = uVar1;
  auVar158 = ZEXT3264(local_16c0);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar124 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar77 = ZEXT416((uint)(fVar120 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_16e0._16_16_ = auVar77;
  local_16e0._0_16_ = auVar77;
  auVar166 = ZEXT3264(local_16e0);
  auVar77 = ZEXT416((uint)(fVar124 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_1700._16_16_ = auVar77;
  local_1700._0_16_ = auVar77;
  auVar169 = ZEXT3264(local_1700);
  auVar77 = ZEXT416((uint)(fVar126 * 0.99999964));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_1720._16_16_ = auVar77;
  local_1720._0_16_ = auVar77;
  auVar179 = ZEXT3264(local_1720);
  auVar77 = ZEXT416((uint)(fVar120 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_1740._16_16_ = auVar77;
  local_1740._0_16_ = auVar77;
  auVar194 = ZEXT3264(local_1740);
  auVar77 = ZEXT416((uint)(fVar124 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_1760._16_16_ = auVar77;
  local_1760._0_16_ = auVar77;
  auVar202 = ZEXT3264(local_1760);
  auVar77 = ZEXT416((uint)(fVar126 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  local_1780._16_16_ = auVar77;
  local_1780._0_16_ = auVar77;
  auVar204 = ZEXT3264(local_1780);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar70 = uVar73 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_1640._4_4_ = iVar2;
  local_1640._0_4_ = iVar2;
  local_1640._8_4_ = iVar2;
  local_1640._12_4_ = iVar2;
  local_1640._16_4_ = iVar2;
  local_1640._20_4_ = iVar2;
  local_1640._24_4_ = iVar2;
  local_1640._28_4_ = iVar2;
  auVar105 = ZEXT3264(local_1640);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1660._4_4_ = iVar2;
  local_1660._0_4_ = iVar2;
  local_1660._8_4_ = iVar2;
  local_1660._12_4_ = iVar2;
  local_1660._16_4_ = iVar2;
  local_1660._20_4_ = iVar2;
  local_1660._24_4_ = iVar2;
  local_1660._28_4_ = iVar2;
  auVar113 = ZEXT3264(local_1660);
  local_15e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_15e0._0_16_ = mm_lookupmask_ps._0_16_;
  uVar69 = 1 << ((byte)k & 0x1f);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar78._8_4_ = 0xbf800000;
  auVar78._0_8_ = 0xbf800000bf800000;
  auVar78._12_4_ = 0xbf800000;
  auVar78._16_4_ = 0xbf800000;
  auVar78._20_4_ = 0xbf800000;
  auVar78._24_4_ = 0xbf800000;
  auVar78._28_4_ = 0xbf800000;
  _local_1600 = vblendvps_avx(auVar97,auVar78,local_15e0);
  local_1910 = local_11f8;
LAB_0106e72a:
  do {
    puVar72 = local_1910;
    if (puVar72 == &local_1200) {
LAB_0106f369:
      return puVar72 != &local_1200;
    }
    local_1910 = puVar72 + -1;
    uVar76 = puVar72[-1];
    while ((uVar76 & 8) == 0) {
      auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar73),auVar150._0_32_);
      auVar25._4_4_ = auVar166._4_4_ * auVar78._4_4_;
      auVar25._0_4_ = auVar166._0_4_ * auVar78._0_4_;
      auVar25._8_4_ = auVar166._8_4_ * auVar78._8_4_;
      auVar25._12_4_ = auVar166._12_4_ * auVar78._12_4_;
      auVar25._16_4_ = auVar166._16_4_ * auVar78._16_4_;
      auVar25._20_4_ = auVar166._20_4_ * auVar78._20_4_;
      auVar25._24_4_ = auVar166._24_4_ * auVar78._24_4_;
      auVar25._28_4_ = auVar78._28_4_;
      auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar75),auVar152._0_32_);
      auVar26._4_4_ = auVar169._4_4_ * auVar78._4_4_;
      auVar26._0_4_ = auVar169._0_4_ * auVar78._0_4_;
      auVar26._8_4_ = auVar169._8_4_ * auVar78._8_4_;
      auVar26._12_4_ = auVar169._12_4_ * auVar78._12_4_;
      auVar26._16_4_ = auVar169._16_4_ * auVar78._16_4_;
      auVar26._20_4_ = auVar169._20_4_ * auVar78._20_4_;
      auVar26._24_4_ = auVar169._24_4_ * auVar78._24_4_;
      auVar26._28_4_ = auVar78._28_4_;
      auVar78 = vmaxps_avx(auVar25,auVar26);
      auVar97 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar74),auVar158._0_32_);
      auVar27._4_4_ = auVar179._4_4_ * auVar97._4_4_;
      auVar27._0_4_ = auVar179._0_4_ * auVar97._0_4_;
      auVar27._8_4_ = auVar179._8_4_ * auVar97._8_4_;
      auVar27._12_4_ = auVar179._12_4_ * auVar97._12_4_;
      auVar27._16_4_ = auVar179._16_4_ * auVar97._16_4_;
      auVar27._20_4_ = auVar179._20_4_ * auVar97._20_4_;
      auVar27._24_4_ = auVar179._24_4_ * auVar97._24_4_;
      auVar27._28_4_ = auVar97._28_4_;
      auVar97 = vmaxps_avx(auVar27,auVar105._0_32_);
      auVar78 = vmaxps_avx(auVar78,auVar97);
      auVar97 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar70),auVar150._0_32_);
      auVar28._4_4_ = auVar194._4_4_ * auVar97._4_4_;
      auVar28._0_4_ = auVar194._0_4_ * auVar97._0_4_;
      auVar28._8_4_ = auVar194._8_4_ * auVar97._8_4_;
      auVar28._12_4_ = auVar194._12_4_ * auVar97._12_4_;
      auVar28._16_4_ = auVar194._16_4_ * auVar97._16_4_;
      auVar28._20_4_ = auVar194._20_4_ * auVar97._20_4_;
      auVar28._24_4_ = auVar194._24_4_ * auVar97._24_4_;
      auVar28._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + (uVar75 ^ 0x20)),auVar152._0_32_);
      auVar29._4_4_ = auVar202._4_4_ * auVar97._4_4_;
      auVar29._0_4_ = auVar202._0_4_ * auVar97._0_4_;
      auVar29._8_4_ = auVar202._8_4_ * auVar97._8_4_;
      auVar29._12_4_ = auVar202._12_4_ * auVar97._12_4_;
      auVar29._16_4_ = auVar202._16_4_ * auVar97._16_4_;
      auVar29._20_4_ = auVar202._20_4_ * auVar97._20_4_;
      auVar29._24_4_ = auVar202._24_4_ * auVar97._24_4_;
      auVar29._28_4_ = auVar97._28_4_;
      auVar97 = vminps_avx(auVar28,auVar29);
      auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + (uVar74 ^ 0x20)),auVar158._0_32_);
      auVar30._4_4_ = auVar204._4_4_ * auVar25._4_4_;
      auVar30._0_4_ = auVar204._0_4_ * auVar25._0_4_;
      auVar30._8_4_ = auVar204._8_4_ * auVar25._8_4_;
      auVar30._12_4_ = auVar204._12_4_ * auVar25._12_4_;
      auVar30._16_4_ = auVar204._16_4_ * auVar25._16_4_;
      auVar30._20_4_ = auVar204._20_4_ * auVar25._20_4_;
      auVar30._24_4_ = auVar204._24_4_ * auVar25._24_4_;
      auVar30._28_4_ = auVar25._28_4_;
      auVar25 = vminps_avx(auVar30,auVar113._0_32_);
      auVar97 = vminps_avx(auVar97,auVar25);
      auVar78 = vcmpps_avx(auVar78,auVar97,2);
      uVar66 = vmovmskps_avx(auVar78);
      if (uVar66 == 0) goto LAB_0106e72a;
      uVar66 = uVar66 & 0xff;
      uVar67 = uVar76 & 0xfffffffffffffff0;
      lVar8 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
        }
      }
      uVar76 = *(ulong *)(uVar67 + lVar8 * 8);
      uVar66 = uVar66 - 1 & uVar66;
      uVar71 = (ulong)uVar66;
      if (uVar66 != 0) {
        do {
          *local_1910 = uVar76;
          local_1910 = local_1910 + 1;
          lVar8 = 0;
          if (uVar71 != 0) {
            for (; (uVar71 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar76 = *(ulong *)(uVar67 + lVar8 * 8);
          uVar71 = uVar71 - 1 & uVar71;
        } while (uVar71 != 0);
      }
    }
    uVar67 = uVar76 & 0xfffffffffffffff0;
    for (local_1908 = 0; local_1908 != (ulong)((uint)uVar76 & 0xf) - 8; local_1908 = local_1908 + 1)
    {
      lVar68 = local_1908 * 0xe0;
      lVar8 = uVar67 + 0xd0 + lVar68;
      local_1520 = *(undefined8 *)(lVar8 + 0x10);
      uStack_1518 = *(undefined8 *)(lVar8 + 0x18);
      lVar8 = uVar67 + 0xc0 + lVar68;
      local_1500 = *(undefined8 *)(lVar8 + 0x10);
      uStack_14f8 = *(undefined8 *)(lVar8 + 0x18);
      uStack_14f0 = local_1500;
      uStack_14e8 = uStack_14f8;
      uStack_1510 = local_1520;
      uStack_1508 = uStack_1518;
      auVar79._16_16_ = *(undefined1 (*) [16])(uVar67 + 0x60 + lVar68);
      auVar79._0_16_ = *(undefined1 (*) [16])(uVar67 + lVar68);
      auVar87._16_16_ = *(undefined1 (*) [16])(uVar67 + 0x70 + lVar68);
      auVar87._0_16_ = *(undefined1 (*) [16])(uVar67 + 0x10 + lVar68);
      auVar98._16_16_ = *(undefined1 (*) [16])(uVar67 + 0x80 + lVar68);
      auVar98._0_16_ = *(undefined1 (*) [16])(uVar67 + 0x20 + lVar68);
      auVar77 = *(undefined1 (*) [16])(uVar67 + 0x30 + lVar68);
      auVar122._16_16_ = auVar77;
      auVar122._0_16_ = auVar77;
      auVar77 = *(undefined1 (*) [16])(uVar67 + 0x40 + lVar68);
      auVar134._16_16_ = auVar77;
      auVar134._0_16_ = auVar77;
      auVar77 = *(undefined1 (*) [16])(uVar67 + 0x50 + lVar68);
      auVar148._16_16_ = auVar77;
      auVar148._0_16_ = auVar77;
      auVar77 = *(undefined1 (*) [16])(uVar67 + 0x90 + lVar68);
      auVar151._16_16_ = auVar77;
      auVar151._0_16_ = auVar77;
      auVar77 = *(undefined1 (*) [16])(uVar67 + 0xa0 + lVar68);
      auVar156._16_16_ = auVar77;
      auVar156._0_16_ = auVar77;
      auVar4 = *(undefined1 (*) [16])(uVar67 + 0xb0 + lVar68);
      auVar165._16_16_ = auVar4;
      auVar165._0_16_ = auVar4;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar168._4_4_ = uVar1;
      auVar168._0_4_ = uVar1;
      auVar168._8_4_ = uVar1;
      auVar168._12_4_ = uVar1;
      auVar168._16_4_ = uVar1;
      auVar168._20_4_ = uVar1;
      auVar168._24_4_ = uVar1;
      auVar168._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar178._4_4_ = uVar1;
      auVar178._0_4_ = uVar1;
      auVar178._8_4_ = uVar1;
      auVar178._12_4_ = uVar1;
      auVar178._16_4_ = uVar1;
      auVar178._20_4_ = uVar1;
      auVar178._24_4_ = uVar1;
      auVar178._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar201._4_4_ = uVar1;
      auVar201._0_4_ = uVar1;
      auVar201._8_4_ = uVar1;
      auVar201._12_4_ = uVar1;
      auVar201._16_4_ = uVar1;
      auVar201._20_4_ = uVar1;
      auVar201._24_4_ = uVar1;
      auVar201._28_4_ = uVar1;
      auVar78 = vsubps_avx(auVar79,auVar168);
      local_1800 = vsubps_avx(auVar87,auVar178);
      local_1820 = vsubps_avx(auVar98,auVar201);
      auVar97 = vsubps_avx(auVar122,auVar168);
      auVar25 = vsubps_avx(auVar134,auVar178);
      auVar26 = vsubps_avx(auVar148,auVar201);
      auVar27 = vsubps_avx(auVar151,auVar168);
      auVar28 = vsubps_avx(auVar156,auVar178);
      auVar29 = vsubps_avx(auVar165,auVar201);
      local_1840 = vsubps_avx(auVar27,auVar78);
      local_1860 = vsubps_avx(auVar28,local_1800);
      local_1540 = vsubps_avx(auVar29,local_1820);
      fVar10 = local_1800._0_4_;
      fVar120 = auVar28._0_4_ + fVar10;
      fVar13 = local_1800._4_4_;
      fVar124 = auVar28._4_4_ + fVar13;
      fVar92 = local_1800._8_4_;
      fVar126 = auVar28._8_4_ + fVar92;
      fVar95 = local_1800._12_4_;
      fVar127 = auVar28._12_4_ + fVar95;
      fVar15 = local_1800._16_4_;
      fVar128 = auVar28._16_4_ + fVar15;
      fVar18 = local_1800._20_4_;
      fVar129 = auVar28._20_4_ + fVar18;
      fVar21 = local_1800._24_4_;
      fVar130 = auVar28._24_4_ + fVar21;
      fVar11 = local_1820._0_4_;
      fVar131 = auVar29._0_4_ + fVar11;
      fVar90 = local_1820._4_4_;
      fVar135 = auVar29._4_4_ + fVar90;
      fVar93 = local_1820._8_4_;
      fVar138 = auVar29._8_4_ + fVar93;
      fVar96 = local_1820._12_4_;
      fVar140 = auVar29._12_4_ + fVar96;
      fVar16 = local_1820._16_4_;
      fVar142 = auVar29._16_4_ + fVar16;
      fVar19 = local_1820._20_4_;
      fVar144 = auVar29._20_4_ + fVar19;
      fVar22 = local_1820._24_4_;
      fVar146 = auVar29._24_4_ + fVar22;
      fVar155 = local_1820._28_4_;
      fVar82 = local_1540._0_4_;
      fVar83 = local_1540._4_4_;
      auVar31._4_4_ = fVar124 * fVar83;
      auVar31._0_4_ = fVar120 * fVar82;
      fVar84 = local_1540._8_4_;
      auVar31._8_4_ = fVar126 * fVar84;
      fVar85 = local_1540._12_4_;
      auVar31._12_4_ = fVar127 * fVar85;
      fVar86 = local_1540._16_4_;
      auVar31._16_4_ = fVar128 * fVar86;
      fVar133 = local_1540._20_4_;
      auVar31._20_4_ = fVar129 * fVar133;
      fVar137 = local_1540._24_4_;
      auVar31._24_4_ = fVar130 * fVar137;
      auVar31._28_4_ = auVar77._12_4_;
      fVar176 = local_1860._0_4_;
      fVar180 = local_1860._4_4_;
      auVar32._4_4_ = fVar180 * fVar135;
      auVar32._0_4_ = fVar176 * fVar131;
      fVar182 = local_1860._8_4_;
      auVar32._8_4_ = fVar182 * fVar138;
      fVar184 = local_1860._12_4_;
      auVar32._12_4_ = fVar184 * fVar140;
      fVar186 = local_1860._16_4_;
      auVar32._16_4_ = fVar186 * fVar142;
      fVar188 = local_1860._20_4_;
      auVar32._20_4_ = fVar188 * fVar144;
      fVar190 = local_1860._24_4_;
      auVar32._24_4_ = fVar190 * fVar146;
      auVar32._28_4_ = auVar4._12_4_;
      auVar30 = vsubps_avx(auVar32,auVar31);
      fVar12 = auVar78._0_4_;
      fVar154 = auVar27._0_4_ + fVar12;
      fVar91 = auVar78._4_4_;
      fVar159 = auVar27._4_4_ + fVar91;
      fVar94 = auVar78._8_4_;
      fVar160 = auVar27._8_4_ + fVar94;
      fVar14 = auVar78._12_4_;
      fVar161 = auVar27._12_4_ + fVar14;
      fVar17 = auVar78._16_4_;
      fVar162 = auVar27._16_4_ + fVar17;
      fVar20 = auVar78._20_4_;
      fVar163 = auVar27._20_4_ + fVar20;
      fVar23 = auVar78._24_4_;
      fVar164 = auVar27._24_4_ + fVar23;
      fVar167 = local_1840._0_4_;
      fVar170 = local_1840._4_4_;
      auVar33._4_4_ = fVar170 * fVar135;
      auVar33._0_4_ = fVar167 * fVar131;
      fVar171 = local_1840._8_4_;
      auVar33._8_4_ = fVar171 * fVar138;
      fVar172 = local_1840._12_4_;
      auVar33._12_4_ = fVar172 * fVar140;
      fVar173 = local_1840._16_4_;
      auVar33._16_4_ = fVar173 * fVar142;
      fVar174 = local_1840._20_4_;
      auVar33._20_4_ = fVar174 * fVar144;
      fVar175 = local_1840._24_4_;
      auVar33._24_4_ = fVar175 * fVar146;
      auVar33._28_4_ = auVar29._28_4_ + fVar155;
      auVar34._4_4_ = fVar159 * fVar83;
      auVar34._0_4_ = fVar154 * fVar82;
      auVar34._8_4_ = fVar160 * fVar84;
      auVar34._12_4_ = fVar161 * fVar85;
      auVar34._16_4_ = fVar162 * fVar86;
      auVar34._20_4_ = fVar163 * fVar133;
      auVar34._24_4_ = fVar164 * fVar137;
      auVar34._28_4_ = auVar4._12_4_;
      auVar31 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = fVar159 * fVar180;
      auVar35._0_4_ = fVar154 * fVar176;
      auVar35._8_4_ = fVar160 * fVar182;
      auVar35._12_4_ = fVar161 * fVar184;
      auVar35._16_4_ = fVar162 * fVar186;
      auVar35._20_4_ = fVar163 * fVar188;
      auVar35._24_4_ = fVar164 * fVar190;
      auVar35._28_4_ = auVar27._28_4_ + auVar78._28_4_;
      auVar36._4_4_ = fVar170 * fVar124;
      auVar36._0_4_ = fVar167 * fVar120;
      auVar36._8_4_ = fVar171 * fVar126;
      auVar36._12_4_ = fVar172 * fVar127;
      auVar36._16_4_ = fVar173 * fVar128;
      auVar36._20_4_ = fVar174 * fVar129;
      auVar36._24_4_ = fVar175 * fVar130;
      auVar36._28_4_ = auVar28._28_4_ + local_1800._28_4_;
      auVar32 = vsubps_avx(auVar36,auVar35);
      fVar120 = *(float *)(ray + k * 4 + 0xa0);
      fVar124 = *(float *)(ray + k * 4 + 0xc0);
      fVar126 = *(float *)(ray + k * 4 + 0x80);
      local_17e0._0_4_ = auVar30._0_4_ * fVar126 + auVar32._0_4_ * fVar124 + fVar120 * auVar31._0_4_
      ;
      local_17e0._4_4_ = auVar30._4_4_ * fVar126 + auVar32._4_4_ * fVar124 + fVar120 * auVar31._4_4_
      ;
      local_17e0._8_4_ = auVar30._8_4_ * fVar126 + auVar32._8_4_ * fVar124 + fVar120 * auVar31._8_4_
      ;
      local_17e0._12_4_ =
           auVar30._12_4_ * fVar126 + auVar32._12_4_ * fVar124 + fVar120 * auVar31._12_4_;
      local_17e0._16_4_ =
           auVar30._16_4_ * fVar126 + auVar32._16_4_ * fVar124 + fVar120 * auVar31._16_4_;
      local_17e0._20_4_ =
           auVar30._20_4_ * fVar126 + auVar32._20_4_ * fVar124 + fVar120 * auVar31._20_4_;
      local_17e0._24_4_ =
           auVar30._24_4_ * fVar126 + auVar32._24_4_ * fVar124 + fVar120 * auVar31._24_4_;
      local_17e0._28_4_ = auVar31._28_4_ + auVar32._28_4_ + auVar31._28_4_;
      local_1560 = vsubps_avx(local_1800,auVar25);
      auVar31 = vsubps_avx(local_1820,auVar26);
      fVar142 = fVar10 + auVar25._0_4_;
      fVar144 = fVar13 + auVar25._4_4_;
      fVar146 = fVar92 + auVar25._8_4_;
      fVar154 = fVar95 + auVar25._12_4_;
      fVar159 = fVar15 + auVar25._16_4_;
      fVar160 = fVar18 + auVar25._20_4_;
      fVar161 = fVar21 + auVar25._24_4_;
      fVar127 = auVar25._28_4_;
      fVar128 = auVar26._0_4_ + fVar11;
      fVar129 = auVar26._4_4_ + fVar90;
      fVar130 = auVar26._8_4_ + fVar93;
      fVar131 = auVar26._12_4_ + fVar96;
      fVar135 = auVar26._16_4_ + fVar16;
      fVar138 = auVar26._20_4_ + fVar19;
      fVar140 = auVar26._24_4_ + fVar22;
      fVar153 = auVar26._28_4_;
      fVar193 = auVar31._0_4_;
      fVar195 = auVar31._4_4_;
      auVar37._4_4_ = fVar195 * fVar144;
      auVar37._0_4_ = fVar193 * fVar142;
      fVar196 = auVar31._8_4_;
      auVar37._8_4_ = fVar196 * fVar146;
      fVar197 = auVar31._12_4_;
      auVar37._12_4_ = fVar197 * fVar154;
      fVar198 = auVar31._16_4_;
      auVar37._16_4_ = fVar198 * fVar159;
      fVar199 = auVar31._20_4_;
      auVar37._20_4_ = fVar199 * fVar160;
      fVar200 = auVar31._24_4_;
      auVar37._24_4_ = fVar200 * fVar161;
      auVar37._28_4_ = auVar30._28_4_;
      fVar132 = local_1560._0_4_;
      fVar136 = local_1560._4_4_;
      auVar38._4_4_ = fVar136 * fVar129;
      auVar38._0_4_ = fVar132 * fVar128;
      fVar139 = local_1560._8_4_;
      auVar38._8_4_ = fVar139 * fVar130;
      fVar141 = local_1560._12_4_;
      auVar38._12_4_ = fVar141 * fVar131;
      fVar143 = local_1560._16_4_;
      auVar38._16_4_ = fVar143 * fVar135;
      fVar145 = local_1560._20_4_;
      auVar38._20_4_ = fVar145 * fVar138;
      fVar147 = local_1560._24_4_;
      auVar38._24_4_ = fVar147 * fVar140;
      auVar38._28_4_ = fVar155;
      auVar30 = vsubps_avx(auVar38,auVar37);
      auVar31 = vsubps_avx(auVar78,auVar97);
      fVar203 = auVar31._0_4_;
      fVar205 = auVar31._4_4_;
      auVar39._4_4_ = fVar205 * fVar129;
      auVar39._0_4_ = fVar203 * fVar128;
      fVar206 = auVar31._8_4_;
      auVar39._8_4_ = fVar206 * fVar130;
      fVar207 = auVar31._12_4_;
      auVar39._12_4_ = fVar207 * fVar131;
      fVar208 = auVar31._16_4_;
      auVar39._16_4_ = fVar208 * fVar135;
      fVar209 = auVar31._20_4_;
      auVar39._20_4_ = fVar209 * fVar138;
      fVar210 = auVar31._24_4_;
      auVar39._24_4_ = fVar210 * fVar140;
      auVar39._28_4_ = fVar153 + fVar155;
      fVar155 = auVar97._0_4_ + fVar12;
      fVar128 = auVar97._4_4_ + fVar91;
      fVar129 = auVar97._8_4_ + fVar94;
      fVar130 = auVar97._12_4_ + fVar14;
      fVar131 = auVar97._16_4_ + fVar17;
      fVar135 = auVar97._20_4_ + fVar20;
      fVar138 = auVar97._24_4_ + fVar23;
      fVar192 = auVar97._28_4_;
      auVar40._4_4_ = fVar128 * fVar195;
      auVar40._0_4_ = fVar155 * fVar193;
      auVar40._8_4_ = fVar129 * fVar196;
      auVar40._12_4_ = fVar130 * fVar197;
      auVar40._16_4_ = fVar131 * fVar198;
      auVar40._20_4_ = fVar135 * fVar199;
      auVar40._24_4_ = fVar138 * fVar200;
      auVar40._28_4_ = fVar192;
      auVar31 = vsubps_avx(auVar40,auVar39);
      auVar41._4_4_ = fVar128 * fVar136;
      auVar41._0_4_ = fVar155 * fVar132;
      auVar41._8_4_ = fVar129 * fVar139;
      auVar41._12_4_ = fVar130 * fVar141;
      auVar41._16_4_ = fVar131 * fVar143;
      auVar41._20_4_ = fVar135 * fVar145;
      auVar41._24_4_ = fVar138 * fVar147;
      auVar41._28_4_ = fVar192 + auVar78._28_4_;
      auVar42._4_4_ = fVar205 * fVar144;
      auVar42._0_4_ = fVar203 * fVar142;
      auVar42._8_4_ = fVar206 * fVar146;
      auVar42._12_4_ = fVar207 * fVar154;
      auVar42._16_4_ = fVar208 * fVar159;
      auVar42._20_4_ = fVar209 * fVar160;
      auVar42._24_4_ = fVar210 * fVar161;
      auVar42._28_4_ = local_1800._28_4_ + fVar127;
      auVar78 = vsubps_avx(auVar42,auVar41);
      local_15c0._0_4_ = fVar126 * auVar30._0_4_ + auVar78._0_4_ * fVar124 + fVar120 * auVar31._0_4_
      ;
      local_15c0._4_4_ = fVar126 * auVar30._4_4_ + auVar78._4_4_ * fVar124 + fVar120 * auVar31._4_4_
      ;
      local_15c0._8_4_ = fVar126 * auVar30._8_4_ + auVar78._8_4_ * fVar124 + fVar120 * auVar31._8_4_
      ;
      local_15c0._12_4_ =
           fVar126 * auVar30._12_4_ + auVar78._12_4_ * fVar124 + fVar120 * auVar31._12_4_;
      local_15c0._16_4_ =
           fVar126 * auVar30._16_4_ + auVar78._16_4_ * fVar124 + fVar120 * auVar31._16_4_;
      local_15c0._20_4_ =
           fVar126 * auVar30._20_4_ + auVar78._20_4_ * fVar124 + fVar120 * auVar31._20_4_;
      local_15c0._24_4_ =
           fVar126 * auVar30._24_4_ + auVar78._24_4_ * fVar124 + fVar120 * auVar31._24_4_;
      local_15c0._28_4_ = auVar30._28_4_ + auVar78._28_4_ + auVar31._28_4_;
      auVar78 = vsubps_avx(auVar97,auVar27);
      fVar138 = auVar97._0_4_ + auVar27._0_4_;
      fVar140 = auVar97._4_4_ + auVar27._4_4_;
      fVar142 = auVar97._8_4_ + auVar27._8_4_;
      fVar144 = auVar97._12_4_ + auVar27._12_4_;
      fVar146 = auVar97._16_4_ + auVar27._16_4_;
      fVar154 = auVar97._20_4_ + auVar27._20_4_;
      fVar159 = auVar97._24_4_ + auVar27._24_4_;
      auVar30 = vsubps_avx(auVar25,auVar28);
      fVar160 = auVar25._0_4_ + auVar28._0_4_;
      fVar161 = auVar25._4_4_ + auVar28._4_4_;
      fVar162 = auVar25._8_4_ + auVar28._8_4_;
      fVar163 = auVar25._12_4_ + auVar28._12_4_;
      fVar164 = auVar25._16_4_ + auVar28._16_4_;
      fVar106 = auVar25._20_4_ + auVar28._20_4_;
      fVar107 = auVar25._24_4_ + auVar28._24_4_;
      fVar108 = fVar127 + auVar28._28_4_;
      auVar97 = vsubps_avx(auVar26,auVar29);
      fVar109 = auVar26._0_4_ + auVar29._0_4_;
      fVar114 = auVar26._4_4_ + auVar29._4_4_;
      fVar115 = auVar26._8_4_ + auVar29._8_4_;
      fVar116 = auVar26._12_4_ + auVar29._12_4_;
      fVar117 = auVar26._16_4_ + auVar29._16_4_;
      fVar118 = auVar26._20_4_ + auVar29._20_4_;
      fVar119 = auVar26._24_4_ + auVar29._24_4_;
      fVar177 = auVar97._0_4_;
      fVar181 = auVar97._4_4_;
      auVar43._4_4_ = fVar181 * fVar161;
      auVar43._0_4_ = fVar177 * fVar160;
      fVar183 = auVar97._8_4_;
      auVar43._8_4_ = fVar183 * fVar162;
      fVar185 = auVar97._12_4_;
      auVar43._12_4_ = fVar185 * fVar163;
      fVar187 = auVar97._16_4_;
      auVar43._16_4_ = fVar187 * fVar164;
      fVar189 = auVar97._20_4_;
      auVar43._20_4_ = fVar189 * fVar106;
      fVar191 = auVar97._24_4_;
      auVar43._24_4_ = fVar191 * fVar107;
      auVar43._28_4_ = fVar127;
      fVar155 = auVar30._0_4_;
      fVar127 = auVar30._4_4_;
      auVar44._4_4_ = fVar127 * fVar114;
      auVar44._0_4_ = fVar155 * fVar109;
      fVar128 = auVar30._8_4_;
      auVar44._8_4_ = fVar128 * fVar115;
      fVar129 = auVar30._12_4_;
      auVar44._12_4_ = fVar129 * fVar116;
      fVar130 = auVar30._16_4_;
      auVar44._16_4_ = fVar130 * fVar117;
      fVar131 = auVar30._20_4_;
      auVar44._20_4_ = fVar131 * fVar118;
      fVar135 = auVar30._24_4_;
      auVar44._24_4_ = fVar135 * fVar119;
      auVar44._28_4_ = fVar153;
      auVar97 = vsubps_avx(auVar44,auVar43);
      fVar121 = auVar78._0_4_;
      fVar125 = auVar78._4_4_;
      auVar45._4_4_ = fVar125 * fVar114;
      auVar45._0_4_ = fVar121 * fVar109;
      fVar109 = auVar78._8_4_;
      auVar45._8_4_ = fVar109 * fVar115;
      fVar114 = auVar78._12_4_;
      auVar45._12_4_ = fVar114 * fVar116;
      fVar115 = auVar78._16_4_;
      auVar45._16_4_ = fVar115 * fVar117;
      fVar116 = auVar78._20_4_;
      auVar45._20_4_ = fVar116 * fVar118;
      fVar117 = auVar78._24_4_;
      auVar45._24_4_ = fVar117 * fVar119;
      auVar45._28_4_ = fVar153 + auVar29._28_4_;
      auVar46._4_4_ = fVar181 * fVar140;
      auVar46._0_4_ = fVar177 * fVar138;
      auVar46._8_4_ = fVar183 * fVar142;
      auVar46._12_4_ = fVar185 * fVar144;
      auVar46._16_4_ = fVar187 * fVar146;
      auVar46._20_4_ = fVar189 * fVar154;
      auVar46._24_4_ = fVar191 * fVar159;
      auVar46._28_4_ = fVar153;
      auVar78 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = fVar140 * fVar127;
      auVar47._0_4_ = fVar138 * fVar155;
      auVar47._8_4_ = fVar142 * fVar128;
      auVar47._12_4_ = fVar144 * fVar129;
      auVar47._16_4_ = fVar146 * fVar130;
      auVar47._20_4_ = fVar154 * fVar131;
      auVar47._24_4_ = fVar159 * fVar135;
      auVar47._28_4_ = fVar192 + auVar27._28_4_;
      auVar48._4_4_ = fVar125 * fVar161;
      auVar48._0_4_ = fVar121 * fVar160;
      auVar48._8_4_ = fVar109 * fVar162;
      auVar48._12_4_ = fVar114 * fVar163;
      auVar48._16_4_ = fVar115 * fVar164;
      auVar48._20_4_ = fVar116 * fVar106;
      auVar48._24_4_ = fVar117 * fVar107;
      auVar48._28_4_ = fVar108;
      auVar25 = vsubps_avx(auVar48,auVar47);
      auVar99._0_4_ = fVar126 * auVar97._0_4_ + auVar25._0_4_ * fVar124 + fVar120 * auVar78._0_4_;
      auVar99._4_4_ = fVar126 * auVar97._4_4_ + auVar25._4_4_ * fVar124 + fVar120 * auVar78._4_4_;
      auVar99._8_4_ = fVar126 * auVar97._8_4_ + auVar25._8_4_ * fVar124 + fVar120 * auVar78._8_4_;
      auVar99._12_4_ =
           fVar126 * auVar97._12_4_ + auVar25._12_4_ * fVar124 + fVar120 * auVar78._12_4_;
      auVar99._16_4_ =
           fVar126 * auVar97._16_4_ + auVar25._16_4_ * fVar124 + fVar120 * auVar78._16_4_;
      auVar99._20_4_ =
           fVar126 * auVar97._20_4_ + auVar25._20_4_ * fVar124 + fVar120 * auVar78._20_4_;
      auVar99._24_4_ =
           fVar126 * auVar97._24_4_ + auVar25._24_4_ * fVar124 + fVar120 * auVar78._24_4_;
      auVar99._28_4_ = fVar108 + auVar25._28_4_ + fVar108;
      local_1580._0_4_ = auVar99._0_4_ + local_17e0._0_4_ + local_15c0._0_4_;
      local_1580._4_4_ = auVar99._4_4_ + local_17e0._4_4_ + local_15c0._4_4_;
      local_1580._8_4_ = auVar99._8_4_ + local_17e0._8_4_ + local_15c0._8_4_;
      local_1580._12_4_ = auVar99._12_4_ + local_17e0._12_4_ + local_15c0._12_4_;
      local_1580._16_4_ = auVar99._16_4_ + local_17e0._16_4_ + local_15c0._16_4_;
      local_1580._20_4_ = auVar99._20_4_ + local_17e0._20_4_ + local_15c0._20_4_;
      local_1580._24_4_ = auVar99._24_4_ + local_17e0._24_4_ + local_15c0._24_4_;
      local_1580._28_4_ = auVar99._28_4_ + local_17e0._28_4_ + local_15c0._28_4_;
      auVar78 = vminps_avx(local_17e0,local_15c0);
      auVar78 = vminps_avx(auVar78,auVar99);
      auVar110._8_4_ = 0x7fffffff;
      auVar110._0_8_ = 0x7fffffff7fffffff;
      auVar110._12_4_ = 0x7fffffff;
      auVar110._16_4_ = 0x7fffffff;
      auVar110._20_4_ = 0x7fffffff;
      auVar110._24_4_ = 0x7fffffff;
      auVar110._28_4_ = 0x7fffffff;
      local_15a0 = vandps_avx(local_1580,auVar110);
      fVar138 = local_15a0._0_4_ * 1.1920929e-07;
      fVar140 = local_15a0._4_4_ * 1.1920929e-07;
      auVar49._4_4_ = fVar140;
      auVar49._0_4_ = fVar138;
      fVar142 = local_15a0._8_4_ * 1.1920929e-07;
      auVar49._8_4_ = fVar142;
      fVar144 = local_15a0._12_4_ * 1.1920929e-07;
      auVar49._12_4_ = fVar144;
      fVar146 = local_15a0._16_4_ * 1.1920929e-07;
      auVar49._16_4_ = fVar146;
      fVar154 = local_15a0._20_4_ * 1.1920929e-07;
      auVar49._20_4_ = fVar154;
      fVar159 = local_15a0._24_4_ * 1.1920929e-07;
      auVar49._24_4_ = fVar159;
      auVar49._28_4_ = 0x34000000;
      auVar149._0_8_ = CONCAT44(fVar140,fVar138) ^ 0x8000000080000000;
      auVar149._8_4_ = -fVar142;
      auVar149._12_4_ = -fVar144;
      auVar149._16_4_ = -fVar146;
      auVar149._20_4_ = -fVar154;
      auVar149._24_4_ = -fVar159;
      auVar149._28_4_ = 0xb4000000;
      auVar78 = vcmpps_avx(auVar78,auVar149,5);
      auVar25 = vmaxps_avx(local_17e0,local_15c0);
      auVar97 = vmaxps_avx(auVar25,auVar99);
      auVar97 = vcmpps_avx(auVar97,auVar49,2);
      auVar97 = vorps_avx(auVar78,auVar97);
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0x7f,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0xbf,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f])
      {
LAB_0106f2d6:
        auVar150 = ZEXT3264(local_1680);
        auVar152 = ZEXT3264(local_16a0);
        auVar158 = ZEXT3264(local_16c0);
        auVar166 = ZEXT3264(local_16e0);
        auVar169 = ZEXT3264(local_1700);
        auVar179 = ZEXT3264(local_1720);
        auVar194 = ZEXT3264(local_1740);
        auVar202 = ZEXT3264(local_1760);
        auVar204 = ZEXT3264(local_1780);
        auVar105 = ZEXT3264(local_1640);
        auVar113 = ZEXT3264(local_1660);
      }
      else {
        auVar50._4_4_ = fVar136 * fVar83;
        auVar50._0_4_ = fVar132 * fVar82;
        auVar50._8_4_ = fVar139 * fVar84;
        auVar50._12_4_ = fVar141 * fVar85;
        auVar50._16_4_ = fVar143 * fVar86;
        auVar50._20_4_ = fVar145 * fVar133;
        auVar50._24_4_ = fVar147 * fVar137;
        auVar50._28_4_ = auVar78._28_4_;
        auVar51._4_4_ = fVar180 * fVar195;
        auVar51._0_4_ = fVar176 * fVar193;
        auVar51._8_4_ = fVar182 * fVar196;
        auVar51._12_4_ = fVar184 * fVar197;
        auVar51._16_4_ = fVar186 * fVar198;
        auVar51._20_4_ = fVar188 * fVar199;
        auVar51._24_4_ = fVar190 * fVar200;
        auVar51._28_4_ = 0x34000000;
        auVar26 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = fVar195 * fVar127;
        auVar52._0_4_ = fVar193 * fVar155;
        auVar52._8_4_ = fVar196 * fVar128;
        auVar52._12_4_ = fVar197 * fVar129;
        auVar52._16_4_ = fVar198 * fVar130;
        auVar52._20_4_ = fVar199 * fVar131;
        auVar52._24_4_ = fVar200 * fVar135;
        auVar52._28_4_ = auVar25._28_4_;
        auVar53._4_4_ = fVar136 * fVar181;
        auVar53._0_4_ = fVar132 * fVar177;
        auVar53._8_4_ = fVar139 * fVar183;
        auVar53._12_4_ = fVar141 * fVar185;
        auVar53._16_4_ = fVar143 * fVar187;
        auVar53._20_4_ = fVar145 * fVar189;
        auVar53._24_4_ = fVar147 * fVar191;
        auVar53._28_4_ = fVar153;
        auVar27 = vsubps_avx(auVar53,auVar52);
        auVar157._8_4_ = 0x7fffffff;
        auVar157._0_8_ = 0x7fffffff7fffffff;
        auVar157._12_4_ = 0x7fffffff;
        auVar157._16_4_ = 0x7fffffff;
        auVar157._20_4_ = 0x7fffffff;
        auVar157._24_4_ = 0x7fffffff;
        auVar157._28_4_ = 0x7fffffff;
        auVar78 = vandps_avx(auVar157,auVar50);
        auVar25 = vandps_avx(auVar157,auVar52);
        auVar78 = vcmpps_avx(auVar78,auVar25,1);
        local_1480 = vblendvps_avx(auVar27,auVar26,auVar78);
        auVar54._4_4_ = fVar205 * fVar181;
        auVar54._0_4_ = fVar203 * fVar177;
        auVar54._8_4_ = fVar206 * fVar183;
        auVar54._12_4_ = fVar207 * fVar185;
        auVar54._16_4_ = fVar208 * fVar187;
        auVar54._20_4_ = fVar209 * fVar189;
        auVar54._24_4_ = fVar210 * fVar191;
        auVar54._28_4_ = fVar124;
        auVar55._4_4_ = fVar205 * fVar83;
        auVar55._0_4_ = fVar203 * fVar82;
        auVar55._8_4_ = fVar206 * fVar84;
        auVar55._12_4_ = fVar207 * fVar85;
        auVar55._16_4_ = fVar208 * fVar86;
        auVar55._20_4_ = fVar209 * fVar133;
        auVar55._24_4_ = fVar210 * fVar137;
        auVar55._28_4_ = auVar78._28_4_;
        auVar56._4_4_ = fVar195 * fVar170;
        auVar56._0_4_ = fVar193 * fVar167;
        auVar56._8_4_ = fVar196 * fVar171;
        auVar56._12_4_ = fVar197 * fVar172;
        auVar56._16_4_ = fVar198 * fVar173;
        auVar56._20_4_ = fVar199 * fVar174;
        auVar56._24_4_ = fVar200 * fVar175;
        auVar56._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = fVar195 * fVar125;
        auVar57._0_4_ = fVar193 * fVar121;
        auVar57._8_4_ = fVar196 * fVar109;
        auVar57._12_4_ = fVar197 * fVar114;
        auVar57._16_4_ = fVar198 * fVar115;
        auVar57._20_4_ = fVar199 * fVar116;
        auVar57._24_4_ = fVar200 * fVar117;
        auVar57._28_4_ = fVar126;
        auVar27 = vsubps_avx(auVar57,auVar54);
        auVar78 = vandps_avx(auVar157,auVar56);
        auVar25 = vandps_avx(auVar157,auVar54);
        auVar25 = vcmpps_avx(auVar78,auVar25,1);
        local_1460 = vblendvps_avx(auVar27,auVar26,auVar25);
        auVar58._4_4_ = fVar136 * fVar125;
        auVar58._0_4_ = fVar132 * fVar121;
        auVar58._8_4_ = fVar139 * fVar109;
        auVar58._12_4_ = fVar141 * fVar114;
        auVar58._16_4_ = fVar143 * fVar115;
        auVar58._20_4_ = fVar145 * fVar116;
        auVar58._24_4_ = fVar147 * fVar117;
        auVar58._28_4_ = auVar25._28_4_;
        auVar59._4_4_ = fVar136 * fVar170;
        auVar59._0_4_ = fVar132 * fVar167;
        auVar59._8_4_ = fVar139 * fVar171;
        auVar59._12_4_ = fVar141 * fVar172;
        auVar59._16_4_ = fVar143 * fVar173;
        auVar59._20_4_ = fVar145 * fVar174;
        auVar59._24_4_ = fVar147 * fVar175;
        auVar59._28_4_ = auVar26._28_4_;
        auVar60._4_4_ = fVar205 * fVar180;
        auVar60._0_4_ = fVar203 * fVar176;
        auVar60._8_4_ = fVar206 * fVar182;
        auVar60._12_4_ = fVar207 * fVar184;
        auVar60._16_4_ = fVar208 * fVar186;
        auVar60._20_4_ = fVar209 * fVar188;
        auVar60._24_4_ = fVar210 * fVar190;
        auVar60._28_4_ = auVar78._28_4_;
        auVar61._4_4_ = fVar205 * fVar127;
        auVar61._0_4_ = fVar203 * fVar155;
        auVar61._8_4_ = fVar206 * fVar128;
        auVar61._12_4_ = fVar207 * fVar129;
        auVar61._16_4_ = fVar208 * fVar130;
        auVar61._20_4_ = fVar209 * fVar131;
        auVar61._24_4_ = fVar210 * fVar135;
        auVar61._28_4_ = auVar30._28_4_;
        auVar26 = vsubps_avx(auVar59,auVar60);
        auVar27 = vsubps_avx(auVar61,auVar58);
        auVar78 = vandps_avx(auVar157,auVar60);
        auVar25 = vandps_avx(auVar157,auVar58);
        auVar25 = vcmpps_avx(auVar78,auVar25,1);
        local_1440 = vblendvps_avx(auVar27,auVar26,auVar25);
        auVar77 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        fVar133 = local_1440._0_4_;
        fVar137 = local_1440._4_4_;
        fVar128 = local_1440._8_4_;
        fVar129 = local_1440._12_4_;
        fVar130 = local_1440._16_4_;
        fVar131 = local_1440._20_4_;
        fVar135 = local_1440._24_4_;
        fVar160 = local_1460._0_4_;
        fVar161 = local_1460._4_4_;
        fVar162 = local_1460._8_4_;
        fVar163 = local_1460._12_4_;
        fVar164 = local_1460._16_4_;
        fVar106 = local_1460._20_4_;
        fVar155 = auVar25._28_4_;
        fVar107 = local_1460._24_4_;
        fVar138 = local_1480._0_4_;
        fVar140 = local_1480._4_4_;
        fVar142 = local_1480._8_4_;
        fVar144 = local_1480._12_4_;
        fVar146 = local_1480._16_4_;
        fVar154 = local_1480._20_4_;
        fVar159 = local_1480._24_4_;
        fVar127 = fVar138 * fVar126 + fVar133 * fVar124 + fVar160 * fVar120;
        fVar82 = fVar140 * fVar126 + fVar137 * fVar124 + fVar161 * fVar120;
        fVar83 = fVar142 * fVar126 + fVar128 * fVar124 + fVar162 * fVar120;
        fVar84 = fVar144 * fVar126 + fVar129 * fVar124 + fVar163 * fVar120;
        fVar85 = fVar146 * fVar126 + fVar130 * fVar124 + fVar164 * fVar120;
        fVar86 = fVar154 * fVar126 + fVar131 * fVar124 + fVar106 * fVar120;
        fVar120 = fVar159 * fVar126 + fVar135 * fVar124 + fVar107 * fVar120;
        fVar124 = fVar155 + fVar155 + 0.0;
        auVar80._0_4_ = fVar127 + fVar127;
        auVar80._4_4_ = fVar82 + fVar82;
        auVar80._8_4_ = fVar83 + fVar83;
        auVar80._12_4_ = fVar84 + fVar84;
        auVar80._16_4_ = fVar85 + fVar85;
        auVar80._20_4_ = fVar86 + fVar86;
        auVar80._24_4_ = fVar120 + fVar120;
        auVar80._28_4_ = fVar124 + fVar124;
        fVar127 = fVar138 * fVar12 + fVar133 * fVar11 + fVar160 * fVar10;
        fVar90 = fVar140 * fVar91 + fVar137 * fVar90 + fVar161 * fVar13;
        fVar91 = fVar142 * fVar94 + fVar128 * fVar93 + fVar162 * fVar92;
        fVar92 = fVar144 * fVar14 + fVar129 * fVar96 + fVar163 * fVar95;
        fVar93 = fVar146 * fVar17 + fVar130 * fVar16 + fVar164 * fVar15;
        fVar94 = fVar154 * fVar20 + fVar131 * fVar19 + fVar106 * fVar18;
        fVar95 = fVar159 * fVar23 + fVar135 * fVar22 + fVar107 * fVar21;
        fVar96 = auVar26._28_4_ + fVar155 + auVar26._28_4_;
        auVar97 = vrcpps_avx(auVar80);
        fVar120 = auVar97._0_4_;
        fVar124 = auVar97._4_4_;
        auVar62._4_4_ = auVar80._4_4_ * fVar124;
        auVar62._0_4_ = auVar80._0_4_ * fVar120;
        fVar126 = auVar97._8_4_;
        auVar62._8_4_ = auVar80._8_4_ * fVar126;
        fVar10 = auVar97._12_4_;
        auVar62._12_4_ = auVar80._12_4_ * fVar10;
        fVar11 = auVar97._16_4_;
        auVar62._16_4_ = auVar80._16_4_ * fVar11;
        fVar12 = auVar97._20_4_;
        auVar62._20_4_ = auVar80._20_4_ * fVar12;
        fVar13 = auVar97._24_4_;
        auVar62._24_4_ = auVar80._24_4_ * fVar13;
        auVar62._28_4_ = auVar78._28_4_;
        auVar123._8_4_ = 0x3f800000;
        auVar123._0_8_ = 0x3f8000003f800000;
        auVar123._12_4_ = 0x3f800000;
        auVar123._16_4_ = 0x3f800000;
        auVar123._20_4_ = 0x3f800000;
        auVar123._24_4_ = 0x3f800000;
        auVar123._28_4_ = 0x3f800000;
        auVar78 = vsubps_avx(auVar123,auVar62);
        local_13c0._4_4_ = (fVar90 + fVar90) * (fVar124 + fVar124 * auVar78._4_4_);
        local_13c0._0_4_ = (fVar127 + fVar127) * (fVar120 + fVar120 * auVar78._0_4_);
        local_13c0._8_4_ = (fVar91 + fVar91) * (fVar126 + fVar126 * auVar78._8_4_);
        local_13c0._12_4_ = (fVar92 + fVar92) * (fVar10 + fVar10 * auVar78._12_4_);
        local_13c0._16_4_ = (fVar93 + fVar93) * (fVar11 + fVar11 * auVar78._16_4_);
        local_13c0._20_4_ = (fVar94 + fVar94) * (fVar12 + fVar12 * auVar78._20_4_);
        local_13c0._24_4_ = (fVar95 + fVar95) * (fVar13 + fVar13 * auVar78._24_4_);
        local_13c0._28_4_ = fVar96 + fVar96;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar103._4_4_ = uVar1;
        auVar103._0_4_ = uVar1;
        auVar103._8_4_ = uVar1;
        auVar103._12_4_ = uVar1;
        auVar103._16_4_ = uVar1;
        auVar103._20_4_ = uVar1;
        auVar103._24_4_ = uVar1;
        auVar103._28_4_ = uVar1;
        auVar78 = vcmpps_avx(auVar103,local_13c0,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        local_1620._4_4_ = uVar1;
        local_1620._0_4_ = uVar1;
        local_1620._8_4_ = uVar1;
        local_1620._12_4_ = uVar1;
        local_1620._16_4_ = uVar1;
        local_1620._20_4_ = uVar1;
        local_1620._24_4_ = uVar1;
        local_1620._28_4_ = uVar1;
        auVar97 = vcmpps_avx(local_13c0,local_1620,2);
        auVar78 = vandps_avx(auVar97,auVar78);
        auVar4 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
        auVar77 = vpand_avx(auVar4,auVar77);
        auVar4 = vpmovsxwd_avx(auVar77);
        auVar24 = vpshufd_avx(auVar77,0xee);
        auVar24 = vpmovsxwd_avx(auVar24);
        auVar104._16_16_ = auVar24;
        auVar104._0_16_ = auVar4;
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0x7f,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar24 >> 0x3f,0) == '\0') &&
            (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar24[0xf]) goto LAB_0106f2d6;
        auVar78 = vcmpps_avx(auVar80,_DAT_01f7b000,4);
        auVar4 = vpackssdw_avx(auVar78._0_16_,auVar78._16_16_);
        auVar77 = vpand_avx(auVar77,auVar4);
        auVar4 = vpmovsxwd_avx(auVar77);
        auVar24 = vpunpckhwd_avx(auVar77,auVar77);
        local_1420._16_16_ = auVar24;
        local_1420._0_16_ = auVar4;
        if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_1420 >> 0x7f,0) == '\0') &&
              (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar24 >> 0x3f,0) == '\0') &&
            (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar24[0xf]) goto LAB_0106f2d6;
        local_14e0 = local_17e0._0_4_;
        fStack_14dc = local_17e0._4_4_;
        fStack_14d8 = local_17e0._8_4_;
        fStack_14d4 = local_17e0._12_4_;
        fStack_14d0 = local_17e0._16_4_;
        fStack_14cc = local_17e0._20_4_;
        fStack_14c8 = local_17e0._24_4_;
        fStack_14c4 = local_17e0._28_4_;
        local_14c0 = local_15c0._0_4_;
        fStack_14bc = local_15c0._4_4_;
        fStack_14b8 = local_15c0._8_4_;
        fStack_14b4 = local_15c0._12_4_;
        fStack_14b0 = local_15c0._16_4_;
        fStack_14ac = local_15c0._20_4_;
        fStack_14a8 = local_15c0._24_4_;
        fStack_14a4 = local_15c0._28_4_;
        local_14a0 = local_1580;
        local_1340 = local_15e0;
        auVar78 = vrcpps_avx(local_1580);
        pSVar5 = context->scene;
        fVar120 = auVar78._0_4_;
        fVar124 = auVar78._4_4_;
        auVar63._4_4_ = local_1580._4_4_ * fVar124;
        auVar63._0_4_ = local_1580._0_4_ * fVar120;
        fVar126 = auVar78._8_4_;
        auVar63._8_4_ = local_1580._8_4_ * fVar126;
        fVar10 = auVar78._12_4_;
        auVar63._12_4_ = local_1580._12_4_ * fVar10;
        fVar11 = auVar78._16_4_;
        auVar63._16_4_ = local_1580._16_4_ * fVar11;
        fVar12 = auVar78._20_4_;
        auVar63._20_4_ = local_1580._20_4_ * fVar12;
        fVar13 = auVar78._24_4_;
        auVar63._24_4_ = local_1580._24_4_ * fVar13;
        auVar63._28_4_ = auVar24._12_4_;
        auVar111._8_4_ = 0x3f800000;
        auVar111._0_8_ = 0x3f8000003f800000;
        auVar111._12_4_ = 0x3f800000;
        auVar111._16_4_ = 0x3f800000;
        auVar111._20_4_ = 0x3f800000;
        auVar111._24_4_ = 0x3f800000;
        auVar111._28_4_ = 0x3f800000;
        auVar97 = vsubps_avx(auVar111,auVar63);
        auVar88._0_4_ = fVar120 + fVar120 * auVar97._0_4_;
        auVar88._4_4_ = fVar124 + fVar124 * auVar97._4_4_;
        auVar88._8_4_ = fVar126 + fVar126 * auVar97._8_4_;
        auVar88._12_4_ = fVar10 + fVar10 * auVar97._12_4_;
        auVar88._16_4_ = fVar11 + fVar11 * auVar97._16_4_;
        auVar88._20_4_ = fVar12 + fVar12 * auVar97._20_4_;
        auVar88._24_4_ = fVar13 + fVar13 * auVar97._24_4_;
        auVar88._28_4_ = auVar78._28_4_ + auVar97._28_4_;
        auVar100._8_4_ = 0x219392ef;
        auVar100._0_8_ = 0x219392ef219392ef;
        auVar100._12_4_ = 0x219392ef;
        auVar100._16_4_ = 0x219392ef;
        auVar100._20_4_ = 0x219392ef;
        auVar100._24_4_ = 0x219392ef;
        auVar100._28_4_ = 0x219392ef;
        auVar97 = vcmpps_avx(local_15a0,auVar100,5);
        auVar78 = vandps_avx(auVar97,auVar88);
        auVar64._4_4_ = local_17e0._4_4_ * auVar78._4_4_;
        auVar64._0_4_ = local_17e0._0_4_ * auVar78._0_4_;
        auVar64._8_4_ = local_17e0._8_4_ * auVar78._8_4_;
        auVar64._12_4_ = local_17e0._12_4_ * auVar78._12_4_;
        auVar64._16_4_ = local_17e0._16_4_ * auVar78._16_4_;
        auVar64._20_4_ = local_17e0._20_4_ * auVar78._20_4_;
        auVar64._24_4_ = local_17e0._24_4_ * auVar78._24_4_;
        auVar64._28_4_ = auVar97._28_4_;
        auVar97 = vminps_avx(auVar64,auVar111);
        auVar65._4_4_ = local_15c0._4_4_ * auVar78._4_4_;
        auVar65._0_4_ = local_15c0._0_4_ * auVar78._0_4_;
        auVar65._8_4_ = local_15c0._8_4_ * auVar78._8_4_;
        auVar65._12_4_ = local_15c0._12_4_ * auVar78._12_4_;
        auVar65._16_4_ = local_15c0._16_4_ * auVar78._16_4_;
        auVar65._20_4_ = local_15c0._20_4_ * auVar78._20_4_;
        auVar65._24_4_ = local_15c0._24_4_ * auVar78._24_4_;
        auVar65._28_4_ = auVar78._28_4_;
        auVar78 = vminps_avx(auVar65,auVar111);
        auVar25 = vsubps_avx(auVar111,auVar97);
        auVar26 = vsubps_avx(auVar111,auVar78);
        local_13e0 = vblendvps_avx(auVar78,auVar25,local_15e0);
        local_1400 = vblendvps_avx(auVar97,auVar26,local_15e0);
        local_13a0._4_4_ = fVar140 * (float)local_1600._4_4_;
        local_13a0._0_4_ = fVar138 * (float)local_1600._0_4_;
        local_13a0._8_4_ = fVar142 * fStack_15f8;
        local_13a0._12_4_ = fVar144 * fStack_15f4;
        local_13a0._16_4_ = fVar146 * fStack_15f0;
        local_13a0._20_4_ = fVar154 * fStack_15ec;
        local_13a0._24_4_ = fVar159 * fStack_15e8;
        local_13a0._28_4_ = local_1400._28_4_;
        local_1380._4_4_ = fVar161 * (float)local_1600._4_4_;
        local_1380._0_4_ = fVar160 * (float)local_1600._0_4_;
        local_1380._8_4_ = fVar162 * fStack_15f8;
        local_1380._12_4_ = fVar163 * fStack_15f4;
        local_1380._16_4_ = fVar164 * fStack_15f0;
        local_1380._20_4_ = fVar106 * fStack_15ec;
        local_1380._24_4_ = fVar107 * fStack_15e8;
        local_1380._28_4_ = auVar97._28_4_;
        local_1360[0] = (float)local_1600._0_4_ * fVar133;
        local_1360[1] = (float)local_1600._4_4_ * fVar137;
        local_1360[2] = fStack_15f8 * fVar128;
        local_1360[3] = fStack_15f4 * fVar129;
        fStack_1350 = fStack_15f0 * fVar130;
        fStack_134c = fStack_15ec * fVar131;
        fStack_1348 = fStack_15e8 * fVar135;
        uStack_1344 = uStack_15e4;
        auVar77 = vpacksswb_avx(auVar77,auVar77);
        uVar71 = (ulong)(byte)(SUB161(auVar77 >> 7,0) & 1 | (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar77 >> 0x37,0) & 1) << 6 | SUB161(auVar77 >> 0x3f,0) << 7
                              );
        auVar150 = ZEXT3264(local_1680);
        auVar152 = ZEXT3264(local_16a0);
        auVar158 = ZEXT3264(local_16c0);
        auVar166 = ZEXT3264(local_16e0);
        auVar169 = ZEXT3264(local_1700);
        auVar179 = ZEXT3264(local_1720);
        auVar194 = ZEXT3264(local_1740);
        auVar202 = ZEXT3264(local_1760);
        auVar204 = ZEXT3264(local_1780);
        auVar105 = ZEXT3264(local_1640);
        auVar113 = ZEXT3264(local_1660);
        do {
          uVar9 = 0;
          if (uVar71 != 0) {
            for (; (uVar71 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar66 = *(uint *)((long)&local_1500 + uVar9 * 4);
          pGVar6 = (pSVar5->geometries).items[uVar66].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_17e0._0_8_ = uVar71;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_12c0 = *(undefined4 *)(local_1400 + uVar9 * 4);
              local_12a0 = *(undefined4 *)(local_13e0 + uVar9 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_13c0 + uVar9 * 4);
              local_17b0.context = context->user;
              local_1280 = *(undefined4 *)((long)&local_1520 + uVar9 * 4);
              uVar1 = *(undefined4 *)(local_13a0 + uVar9 * 4);
              auVar112._4_4_ = uVar1;
              auVar112._0_4_ = uVar1;
              auVar112._8_4_ = uVar1;
              auVar112._12_4_ = uVar1;
              auVar112._16_4_ = uVar1;
              auVar112._20_4_ = uVar1;
              auVar112._24_4_ = uVar1;
              auVar112._28_4_ = uVar1;
              uVar3 = *(undefined4 *)(local_1380 + uVar9 * 4);
              local_1300._4_4_ = uVar3;
              local_1300._0_4_ = uVar3;
              local_1300._8_4_ = uVar3;
              local_1300._12_4_ = uVar3;
              local_1300._16_4_ = uVar3;
              local_1300._20_4_ = uVar3;
              local_1300._24_4_ = uVar3;
              local_1300._28_4_ = uVar3;
              local_1250 = vpshufd_avx(ZEXT416(uVar66),0);
              fVar120 = local_1360[uVar9];
              local_12e0._4_4_ = fVar120;
              local_12e0._0_4_ = fVar120;
              local_12e0._8_4_ = fVar120;
              local_12e0._12_4_ = fVar120;
              local_12e0._16_4_ = fVar120;
              local_12e0._20_4_ = fVar120;
              local_12e0._24_4_ = fVar120;
              local_12e0._28_4_ = fVar120;
              local_1320[0] = (RTCHitN)(char)uVar1;
              local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[4] = (RTCHitN)(char)uVar1;
              local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[8] = (RTCHitN)(char)uVar1;
              local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[0xc] = (RTCHitN)(char)uVar1;
              local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[0x10] = (RTCHitN)(char)uVar1;
              local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[0x14] = (RTCHitN)(char)uVar1;
              local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[0x18] = (RTCHitN)(char)uVar1;
              local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1320[0x1c] = (RTCHitN)(char)uVar1;
              local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              uStack_12bc = local_12c0;
              uStack_12b8 = local_12c0;
              uStack_12b4 = local_12c0;
              uStack_12b0 = local_12c0;
              uStack_12ac = local_12c0;
              uStack_12a8 = local_12c0;
              uStack_12a4 = local_12c0;
              uStack_129c = local_12a0;
              uStack_1298 = local_12a0;
              uStack_1294 = local_12a0;
              uStack_1290 = local_12a0;
              uStack_128c = local_12a0;
              uStack_1288 = local_12a0;
              uStack_1284 = local_12a0;
              uStack_127c = local_1280;
              uStack_1278 = local_1280;
              uStack_1274 = local_1280;
              uStack_1270 = local_1280;
              uStack_126c = local_1280;
              uStack_1268 = local_1280;
              uStack_1264 = local_1280;
              local_1260 = local_1250;
              auVar78 = vcmpps_avx(auVar112,auVar112,0xf);
              uStack_123c = (local_17b0.context)->instID[0];
              local_1240 = uStack_123c;
              uStack_1238 = uStack_123c;
              uStack_1234 = uStack_123c;
              uStack_1230 = uStack_123c;
              uStack_122c = uStack_123c;
              uStack_1228 = uStack_123c;
              uStack_1224 = uStack_123c;
              uStack_121c = (local_17b0.context)->instPrimID[0];
              local_1220 = uStack_121c;
              uStack_1218 = uStack_121c;
              uStack_1214 = uStack_121c;
              uStack_1210 = uStack_121c;
              uStack_120c = uStack_121c;
              uStack_1208 = uStack_121c;
              uStack_1204 = uStack_121c;
              local_1880 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar69 & 0xf) << 4));
              local_1870 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)((int)uVar69 >> 4) * 0x10);
              local_17b0.valid = (int *)local_1880;
              local_17b0.geometryUserPtr = pGVar6->userPtr;
              local_17b0.hit = local_1320;
              local_17b0.N = 8;
              local_17b0.ray = (RTCRayN *)ray;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                local_1820._0_8_ = k;
                local_1800._0_8_ = ray;
                local_1840._0_8_ = puVar72;
                local_1860._0_8_ = uVar73;
                auVar78 = ZEXT1632(auVar78._0_16_);
                (*pGVar6->occlusionFilterN)(&local_17b0);
                auVar78 = vcmpps_avx(auVar78,auVar78,0xf);
                auVar204 = ZEXT3264(local_1780);
                auVar202 = ZEXT3264(local_1760);
                auVar194 = ZEXT3264(local_1740);
                auVar179 = ZEXT3264(local_1720);
                auVar169 = ZEXT3264(local_1700);
                auVar166 = ZEXT3264(local_16e0);
                auVar158 = ZEXT3264(local_16c0);
                auVar152 = ZEXT3264(local_16a0);
                auVar150 = ZEXT3264(local_1680);
                k = local_1820._0_8_;
                puVar72 = (ulong *)local_1840._0_8_;
                ray = (RayK<8> *)local_1800._0_8_;
                uVar73 = local_1860._0_8_;
              }
              auVar77 = vpcmpeqd_avx(local_1880,ZEXT816(0) << 0x40);
              auVar4 = vpcmpeqd_avx(local_1870,ZEXT816(0) << 0x40);
              auVar101._16_16_ = auVar4;
              auVar101._0_16_ = auVar77;
              auVar97 = auVar78 & ~auVar101;
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0x7f,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0xbf,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar97[0x1f]) {
                auVar81._0_4_ = auVar77._0_4_ ^ auVar78._0_4_;
                auVar81._4_4_ = auVar77._4_4_ ^ auVar78._4_4_;
                auVar81._8_4_ = auVar77._8_4_ ^ auVar78._8_4_;
                auVar81._12_4_ = auVar77._12_4_ ^ auVar78._12_4_;
                auVar81._16_4_ = auVar4._0_4_ ^ auVar78._16_4_;
                auVar81._20_4_ = auVar4._4_4_ ^ auVar78._20_4_;
                auVar81._24_4_ = auVar4._8_4_ ^ auVar78._24_4_;
                auVar81._28_4_ = auVar4._12_4_ ^ auVar78._28_4_;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  local_1820._0_8_ = k;
                  local_1800._0_8_ = ray;
                  local_1840._0_8_ = puVar72;
                  local_1860._0_8_ = uVar73;
                  auVar78 = ZEXT1632(auVar78._0_16_);
                  (*p_Var7)(&local_17b0);
                  auVar78 = vcmpps_avx(auVar78,auVar78,0xf);
                  auVar204 = ZEXT3264(local_1780);
                  auVar202 = ZEXT3264(local_1760);
                  auVar194 = ZEXT3264(local_1740);
                  auVar179 = ZEXT3264(local_1720);
                  auVar169 = ZEXT3264(local_1700);
                  auVar166 = ZEXT3264(local_16e0);
                  auVar158 = ZEXT3264(local_16c0);
                  auVar152 = ZEXT3264(local_16a0);
                  auVar150 = ZEXT3264(local_1680);
                  k = local_1820._0_8_;
                  puVar72 = (ulong *)local_1840._0_8_;
                  ray = (RayK<8> *)local_1800._0_8_;
                  uVar73 = local_1860._0_8_;
                }
                auVar77 = vpcmpeqd_avx(local_1880,ZEXT816(0) << 0x40);
                auVar4 = vpcmpeqd_avx(local_1870,ZEXT816(0) << 0x40);
                auVar89._16_16_ = auVar4;
                auVar89._0_16_ = auVar77;
                auVar81._0_4_ = auVar77._0_4_ ^ auVar78._0_4_;
                auVar81._4_4_ = auVar77._4_4_ ^ auVar78._4_4_;
                auVar81._8_4_ = auVar77._8_4_ ^ auVar78._8_4_;
                auVar81._12_4_ = auVar77._12_4_ ^ auVar78._12_4_;
                auVar81._16_4_ = auVar4._0_4_ ^ auVar78._16_4_;
                auVar81._20_4_ = auVar4._4_4_ ^ auVar78._20_4_;
                auVar81._24_4_ = auVar4._8_4_ ^ auVar78._24_4_;
                auVar81._28_4_ = auVar4._12_4_ ^ auVar78._28_4_;
                auVar102._8_4_ = 0xff800000;
                auVar102._0_8_ = 0xff800000ff800000;
                auVar102._12_4_ = 0xff800000;
                auVar102._16_4_ = 0xff800000;
                auVar102._20_4_ = 0xff800000;
                auVar102._24_4_ = 0xff800000;
                auVar102._28_4_ = 0xff800000;
                auVar78 = vblendvps_avx(auVar102,*(undefined1 (*) [32])(local_17b0.ray + 0x100),
                                        auVar89);
                *(undefined1 (*) [32])(local_17b0.ray + 0x100) = auVar78;
              }
              auVar105 = ZEXT3264(local_1640);
              auVar113 = ZEXT3264(local_1660);
              if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar81 >> 0x7f,0) == '\0') &&
                    (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar81 >> 0xbf,0) == '\0') &&
                  (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar81[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = local_1620._0_4_;
                uVar71 = local_17e0._0_8_ ^ 1L << (uVar9 & 0x3f);
                goto LAB_0106f163;
              }
            }
            *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
            goto LAB_0106f369;
          }
          uVar71 = uVar71 ^ 1L << (uVar9 & 0x3f);
LAB_0106f163:
        } while (uVar71 != 0);
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }